

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

Integer pnga_locate_num_blocks(Integer g_a,Integer *lo,Integer *hi)

{
  long lVar1;
  short sVar2;
  bool bVar3;
  ulong uVar4;
  byte bVar5;
  Integer IVar6;
  long lVar7;
  Integer thi [7];
  Integer tlo [7];
  Integer local_b0 [9];
  Integer local_68 [7];
  
  lVar1 = g_a + 1000;
  sVar2 = GA[lVar1].ndim;
  local_b0[0] = g_a;
  if (0 < (long)sVar2) {
    lVar7 = 0;
    do {
      if (((lo[lVar7] < 1) || (hi[lVar7] < lo[lVar7])) || (GA[g_a + 1000].dims[lVar7] < hi[lVar7]))
      {
        pnga_error("Requested region out of bounds",0);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < GA[lVar1].ndim);
  }
  if (GA[lVar1].distr_type == 0) {
    IVar6 = -1;
  }
  else {
    lVar1 = GA[lVar1].block_total;
    if (lVar1 < 1) {
      IVar6 = 0;
    }
    else {
      lVar7 = 0;
      IVar6 = 0;
      do {
        pnga_distribution(local_b0[0],lVar7,local_68,local_b0 + 1);
        uVar4 = 1;
        if (0 < sVar2) {
          do {
            if (((local_68[uVar4 - 1] < lo[uVar4 - 1]) ||
                (bVar5 = 1, hi[uVar4 - 1] < local_68[uVar4 - 1])) &&
               ((local_b0[uVar4] < lo[uVar4 - 1] || (bVar5 = 1, hi[uVar4 - 1] < local_b0[uVar4]))))
            {
              bVar5 = 0;
            }
          } while ((bVar5 != 0) && (bVar3 = (long)uVar4 < (long)sVar2, uVar4 = uVar4 + 1, bVar3));
          uVar4 = (ulong)bVar5;
        }
        IVar6 = IVar6 + uVar4;
        lVar7 = lVar7 + 1;
      } while (lVar7 != lVar1);
    }
  }
  return IVar6;
}

Assistant:

Integer pnga_locate_num_blocks(Integer g_a, Integer *lo, Integer *hi)
{
  Integer ga_handle = GA_OFFSET + g_a;
  Integer ndim = GA[ga_handle].ndim;
  Integer ret = -1, d;
  Integer cnt;

  for(d = 0; d< GA[ga_handle].ndim; d++)
    if((lo[d]<1 || hi[d]>GA[ga_handle].dims[d]) ||(lo[d]>hi[d]))
      pnga_error("Requested region out of bounds",0);

  if (GA[ga_handle].distr_type != REGULAR) {
    Integer nblocks = GA[ga_handle].block_total;
    Integer chk, i, j, tlo[MAXDIM], thi[MAXDIM];
    cnt = 0;
    for (i=0; i<nblocks; i++) {
      /* check to see if this block overlaps with requested block
       * defined by lo and hi */
      chk = 1;
      /* get limits on block i */
      pnga_distribution(g_a,i,tlo,thi);
      for (j=0; j<ndim && chk==1; j++) {
        /* check to see if at least one end point of the interval
         * represented by blo and bhi falls in the interval
         * represented by lo and hi */
        if (!((tlo[j] >= lo[j] && tlo[j] <= hi[j]) ||
              (thi[j] >= lo[j] && thi[j] <= hi[j]))) {
          chk = 0;
        }
      }

      if (chk) {
        cnt++;
      }
    }
    ret = cnt;
  }

  return ret;
}